

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

LaneArray<2> * __thiscall
wasm::Literal::getLanesI64x2(LaneArray<2> *__return_storage_ptr__,Literal *this)

{
  Literal *in_RDX;
  Literal *this_local;
  
  getLanes<long,2>(__return_storage_ptr__,(wasm *)this,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

LaneArray<2> Literal::getLanesI64x2() const {
  return getLanes<int64_t, 2>(*this);
}